

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMf.c
# Opt level: O1

void Mf_ObjMergeOrder(Mf_Man_t *p,int iObj)

{
  int *pVars;
  float fVar1;
  ushort uVar2;
  uint uVar3;
  uint nCutNum;
  uint uVar4;
  uint uVar5;
  Gia_Obj_t *pGVar6;
  Mf_Obj_t *pMVar7;
  Gia_Man_t *pGVar8;
  undefined8 uVar9;
  Jf_Par_t *pJVar10;
  Mf_Obj_t *pMVar11;
  Gia_Obj_t *pGVar12;
  Mf_Cut_t *pMVar13;
  Mf_Cut_t *pMVar14;
  Vec_Mem_t *pVVar15;
  word **ppwVar16;
  word *pwVar17;
  word *pwVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  uint uVar22;
  ulong uVar23;
  ulong uVar24;
  void *pvVar25;
  void **ppvVar26;
  byte bVar27;
  int iVar28;
  ulong uVar29;
  ulong uVar30;
  int iVar31;
  int iVar32;
  ulong uVar33;
  int iVar34;
  ulong *puVar35;
  long lVar36;
  uint uVar37;
  uint *puVar38;
  int *piVar39;
  uint uVar40;
  uint uVar41;
  Mf_Cut_t *pMVar42;
  int *piVar43;
  ulong uVar44;
  int iVar45;
  uint uVar46;
  uint uVar47;
  uint uVar48;
  uint uVar49;
  int iVar50;
  int iVar51;
  int iVar52;
  word *pwVar53;
  uint uVar54;
  int iVar55;
  long lVar56;
  ulong *puVar57;
  int iVar58;
  uint uVar59;
  bool bVar60;
  bool bVar61;
  bool bVar62;
  float fVar63;
  word uTruth [16];
  word uTruth0 [16];
  Mf_Cut_t *pCutsR [16];
  word uTruth1 [16];
  word uRes [4];
  Mf_Cut_t pCuts2 [16];
  Mf_Cut_t pCuts1 [16];
  Mf_Cut_t pCuts0 [16];
  Mf_Cut_t pCuts [16];
  ulong *local_1388;
  ulong *local_1380;
  uint local_1330;
  ulong local_12f8 [16];
  ulong local_1278;
  ulong local_1270;
  ulong local_1268;
  ulong local_1260;
  word local_1258 [16];
  Mf_Cut_t *local_11d8 [16];
  ulong local_1158 [16];
  word local_10d8 [16];
  word local_1058 [4];
  ulong local_1038 [2];
  uint local_1028;
  uint uStack_1024;
  ulong uStack_1020;
  ulong local_c38 [2];
  uint local_c28;
  int local_c24 [251];
  ulong local_838 [2];
  uint local_828;
  int local_824 [251];
  Mf_Cut_t local_438 [16];
  
  if ((iObj < 0) || (p->pGia->nObjs <= iObj)) {
LAB_0076c669:
    __assert_fail("v >= 0 && v < p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                  ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
  }
  pGVar6 = p->pGia->pObjs;
  pMVar7 = p->pLfObjs;
  uVar3 = p->pPars->nLutSize;
  nCutNum = p->pPars->nCutNum;
  iVar28 = iObj - (*(uint *)(pGVar6 + (uint)iObj) & 0x1fffffff);
  iVar58 = pMVar7[iVar28].iCutSet;
  if (iVar58 == 0) {
    local_838[1] = 0;
    local_828 = 0x8000002;
    local_824[0] = iVar28;
    local_838[0] = 1L << ((byte)iVar28 & 0x3f);
    iVar34 = 1;
  }
  else {
    uVar46 = iVar58 >> 0x10;
    if (((int)uVar46 < 0) || ((p->vPages).nSize <= (int)uVar46)) goto LAB_0076c64a;
    pvVar25 = (p->vPages).pArray[uVar46];
    iVar34 = *(int *)((long)pvVar25 + (ulong)(ushort)iVar58 * 4);
    if (iVar34 < 1) {
      puVar35 = local_838;
    }
    else {
      piVar43 = (int *)((long)pvVar25 + (ulong)(ushort)iVar58 * 4);
      puVar38 = (uint *)(piVar43 + 1);
      puVar35 = local_838;
      iVar58 = 0;
      do {
        puVar35[1] = 0;
        uVar46 = *puVar38;
        *(uint *)(puVar35 + 2) = (uint)puVar35[2] & 0xf8000000 | uVar46 >> 5;
        *(uint *)(puVar35 + 2) = *puVar38 << 0x1b | uVar46 >> 5;
        uVar46 = *puVar38 & 0x1f;
        if (uVar46 == 0) {
          uVar23 = 0;
        }
        else {
          uVar29 = 0;
          uVar23 = 0;
          do {
            uVar23 = uVar23 | 1L << ((ulong)(byte)(puVar38 + 1)[uVar29] & 0x3f);
            uVar29 = uVar29 + 1;
          } while (uVar46 != uVar29);
        }
        *puVar35 = uVar23;
        memcpy((void *)((long)puVar35 + 0x14),puVar38 + 1,(ulong)(uVar46 << 2));
        puVar35 = puVar35 + 8;
        iVar58 = iVar58 + 1;
        puVar38 = puVar38 + (ulong)(*puVar38 & 0x1f) + 1;
        iVar34 = *piVar43;
      } while (iVar58 < iVar34);
    }
    if (0xfffffff < local_828) {
      puVar35[1] = 0;
      *(undefined4 *)(puVar35 + 2) = 0x8000002;
      *(int *)((long)puVar35 + 0x14) = iVar28;
      *puVar35 = 1L << ((byte)iVar28 & 0x3f);
      iVar34 = iVar34 + 1;
    }
  }
  pGVar6 = pGVar6 + (uint)iObj;
  iVar28 = iObj - (*(uint *)&pGVar6->field_0x4 & 0x1fffffff);
  iVar58 = p->pLfObjs[iVar28].iCutSet;
  if (iVar58 == 0) {
    local_c38[1] = 0;
    local_c28 = 0x8000002;
    local_c24[0] = iVar28;
    local_c38[0] = 1L << ((byte)iVar28 & 0x3f);
    iVar31 = 1;
  }
  else {
    uVar46 = iVar58 >> 0x10;
    if (((int)uVar46 < 0) || ((p->vPages).nSize <= (int)uVar46)) goto LAB_0076c64a;
    pvVar25 = (p->vPages).pArray[uVar46];
    iVar31 = *(int *)((long)pvVar25 + (ulong)(ushort)iVar58 * 4);
    if (iVar31 < 1) {
      puVar35 = local_c38;
    }
    else {
      piVar43 = (int *)((long)pvVar25 + (ulong)(ushort)iVar58 * 4);
      puVar38 = (uint *)(piVar43 + 1);
      puVar35 = local_c38;
      iVar58 = 0;
      do {
        puVar35[1] = 0;
        uVar46 = *puVar38;
        *(uint *)(puVar35 + 2) = (uint)puVar35[2] & 0xf8000000 | uVar46 >> 5;
        *(uint *)(puVar35 + 2) = *puVar38 << 0x1b | uVar46 >> 5;
        uVar46 = *puVar38 & 0x1f;
        if (uVar46 == 0) {
          uVar23 = 0;
        }
        else {
          uVar29 = 0;
          uVar23 = 0;
          do {
            uVar23 = uVar23 | 1L << ((ulong)(byte)(puVar38 + 1)[uVar29] & 0x3f);
            uVar29 = uVar29 + 1;
          } while (uVar46 != uVar29);
        }
        *puVar35 = uVar23;
        memcpy((void *)((long)puVar35 + 0x14),puVar38 + 1,(ulong)(uVar46 << 2));
        puVar35 = puVar35 + 8;
        iVar58 = iVar58 + 1;
        puVar38 = puVar38 + (ulong)(*puVar38 & 0x1f) + 1;
        iVar31 = *piVar43;
      } while (iVar58 < iVar31);
    }
    if (0xfffffff < local_c28) {
      puVar35[1] = 0;
      *(undefined4 *)(puVar35 + 2) = 0x8000002;
      *(int *)((long)puVar35 + 0x14) = iVar28;
      *puVar35 = 1L << ((byte)iVar28 & 0x3f);
      iVar31 = iVar31 + 1;
    }
  }
  pGVar8 = p->pGia;
  if (pGVar8->pSibls == (int *)0x0) {
    uVar46 = 0;
  }
  else {
    uVar46 = pGVar8->pSibls[(uint)iObj];
  }
  if (0 < (int)nCutNum) {
    pMVar42 = local_438;
    uVar23 = 0;
    do {
      local_11d8[uVar23] = pMVar42;
      uVar23 = uVar23 + 1;
      pMVar42 = pMVar42 + 1;
    } while (nCutNum != uVar23);
  }
  uVar23 = *(ulong *)pGVar6;
  pMVar7 = pMVar7 + (uint)iObj;
  if (uVar46 == 0) {
    uVar29 = 0;
  }
  else {
    iVar58 = pGVar8->pSibls[(uint)iObj];
    if (((long)iVar58 < 0) || (pGVar8->nObjs <= iVar58)) goto LAB_0076c669;
    uVar9 = *(undefined8 *)(pGVar8->pObjs + iVar58);
    uVar29 = *(ulong *)pGVar6;
    iVar58 = p->pLfObjs[(int)uVar46].iCutSet;
    if (iVar58 == 0) {
      local_1038[1] = 0;
      local_1028 = 0x8000002;
      uStack_1024 = uVar46;
      local_1038[0] = 1L << ((byte)uVar46 & 0x3f);
      iVar28 = 1;
    }
    else {
      uVar46 = iVar58 >> 0x10;
      if (((int)uVar46 < 0) || ((p->vPages).nSize <= (int)uVar46)) goto LAB_0076c64a;
      pvVar25 = (p->vPages).pArray[uVar46];
      iVar28 = *(int *)((long)pvVar25 + (ulong)(ushort)iVar58 * 4);
      if (0 < iVar28) {
        piVar43 = (int *)((long)pvVar25 + (ulong)(ushort)iVar58 * 4);
        puVar38 = (uint *)(piVar43 + 1);
        puVar35 = local_1038;
        iVar58 = 0;
        do {
          puVar35[1] = 0;
          uVar46 = *puVar38;
          *(uint *)(puVar35 + 2) = (uint)puVar35[2] & 0xf8000000 | uVar46 >> 5;
          *(uint *)(puVar35 + 2) = *puVar38 << 0x1b | uVar46 >> 5;
          uVar46 = *puVar38 & 0x1f;
          if (uVar46 == 0) {
            uVar24 = 0;
          }
          else {
            uVar30 = 0;
            uVar24 = 0;
            do {
              uVar24 = uVar24 | 1L << ((ulong)(byte)(puVar38 + 1)[uVar30] & 0x3f);
              uVar30 = uVar30 + 1;
            } while (uVar46 != uVar30);
          }
          *puVar35 = uVar24;
          memcpy((void *)((long)puVar35 + 0x14),puVar38 + 1,(ulong)(uVar46 << 2));
          puVar35 = puVar35 + 8;
          iVar58 = iVar58 + 1;
          puVar38 = puVar38 + (ulong)(*puVar38 & 0x1f) + 1;
          iVar28 = *piVar43;
        } while (iVar58 < iVar28);
      }
    }
    if (iVar28 < 1) {
      uVar46 = 0;
    }
    else {
      puVar35 = local_1038;
      uVar46 = 0;
      do {
        pMVar42 = local_11d8[(int)uVar46];
        uVar24 = *puVar35;
        uVar30 = puVar35[1];
        uVar44 = puVar35[3];
        uVar33 = puVar35[4];
        uVar19 = puVar35[5];
        uVar20 = puVar35[6];
        uVar21 = puVar35[7];
        *(ulong *)&pMVar42->field_0x10 = puVar35[2];
        *(ulong *)(pMVar42->pLeaves + 1) = uVar44;
        *(ulong *)(pMVar42->pLeaves + 7) = uVar20;
        *(ulong *)(pMVar42->pLeaves + 9) = uVar21;
        *(ulong *)(pMVar42->pLeaves + 3) = uVar33;
        *(ulong *)(pMVar42->pLeaves + 5) = uVar19;
        pMVar42->Sign = uVar24;
        pMVar42->Delay = (int)uVar30;
        pMVar42->Flow = (float)(int)(uVar30 >> 0x20);
        uVar40 = *(uint *)&pMVar42->field_0x10;
        *(uint *)&pMVar42->field_0x10 =
             uVar40 & 0xf8000000 |
             uVar40 & 0x7ffffff ^ ((uint)((ulong)uVar9 >> 0x20) ^ (uint)(uVar29 >> 0x20)) >> 0x1f;
        uVar54 = uVar40 >> 0x1b;
        pJVar10 = p->pPars;
        if (pJVar10->nLutSize < (int)uVar54) {
LAB_0076c45a:
          __assert_fail("nLeaves <= p->pPars->nLutSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMf.c"
                        ,0x3f3,"void Mf_CutParams(Mf_Man_t *, Mf_Cut_t *, float)");
        }
        fVar1 = pMVar7->nFlowRefs;
        pMVar42->Delay = 0;
        pMVar42->Flow = 0.0;
        if (0x7ffffff < uVar40) {
          pMVar11 = p->pLfObjs;
          uVar24 = 0;
          fVar63 = 0.0;
          uVar41 = 0;
          do {
            iVar58 = pMVar42->pLeaves[uVar24];
            uVar2 = *(ushort *)&pMVar11[iVar58].field_0xc;
            if (uVar41 <= uVar2) {
              uVar41 = (uint)uVar2;
            }
            pMVar42->Delay = uVar41;
            fVar63 = fVar63 + pMVar11[iVar58].Flow;
            pMVar42->Flow = fVar63;
            uVar24 = uVar24 + 1;
          } while (uVar54 != uVar24);
        }
        pMVar42->Delay = (pMVar42->Delay + 1) - (uint)(uVar40 < 0x10000000);
        if (uVar40 < 0x10000000) {
          iVar58 = 0;
        }
        else if (pJVar10->fGenCnf == 0) {
          if (pJVar10->fOptEdge == 0) {
            iVar58 = 1;
          }
          else {
            iVar58 = uVar54 + pJVar10->nAreaTuner;
          }
        }
        else {
          uVar40 = uVar40 >> 1 & 0x3ffffff;
          if ((p->vCnfSizes).nSize <= (int)uVar40) {
LAB_0076c4d6:
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          iVar58 = (p->vCnfSizes).pArray[uVar40];
        }
        pMVar42->Flow = (pMVar42->Flow + (float)iVar58) / fVar1;
        uVar46 = Mf_SetAddCut(local_11d8,uVar46,nCutNum);
        puVar35 = puVar35 + 8;
      } while (puVar35 < local_1038 + (long)iVar28 * 8);
    }
    uVar29 = (ulong)uVar46;
  }
  uVar46 = (uint)(uVar23 >> 0x1d) & 1;
  uVar40 = (uint)(uVar23 >> 0x3d) & 1;
  puVar38 = p->pGia->pMuxes;
  if ((puVar38 == (uint *)0x0) || (puVar38[(uint)iObj] == 0)) {
    uVar54 = (uint)*(ulong *)pGVar6;
    bVar62 = (~uVar54 & 0x1fffffff) != 0;
    bVar61 = (uVar54 & 0x1fffffff) < ((uint)(*(ulong *)pGVar6 >> 0x20) & 0x1fffffff);
    p->CutCount[0] = (double)(iVar31 * iVar34) + p->CutCount[0];
    if (0 < iVar34) {
      local_1330 = uVar3 << 0x1b | 0x7ffffff;
      piVar43 = local_824;
      local_1388 = local_838;
      do {
        if (0 < iVar31) {
          piVar39 = local_c24;
          puVar35 = local_c38;
          do {
            uVar41 = (uint)local_1388[2];
            uVar59 = uVar41 >> 0x1b;
            uVar23 = puVar35[2];
            uVar47 = (uint)uVar23 >> 0x1b;
            if (((int)uVar3 < (int)(uVar47 + uVar59)) &&
               (uVar24 = (*puVar35 | *local_1388) -
                         ((*puVar35 | *local_1388) >> 1 & 0x5555555555555555),
               uVar24 = (uVar24 >> 2 & 0x3333333333333333) + (uVar24 & 0x3333333333333333),
               (int)uVar3 <
               (int)(uint)(byte)(((uVar24 >> 4) + uVar24 & 0xf0f0f0f0f0f0f0f) * 0x101010101010101 >>
                                0x38))) goto LAB_0076b1a9;
            p->CutCount[1] = p->CutCount[1] + 1.0;
            uVar48 = (uint)uVar29;
            pMVar42 = local_11d8[(int)uVar48];
            pVars = pMVar42->pLeaves;
            if ((uVar59 != uVar3) || (uVar47 != uVar3)) {
              iVar58 = 0;
              iVar28 = 0;
              if (uVar41 < 0x8000000) {
LAB_0076a585:
                if ((int)(iVar28 + uVar47) <= (int)(uVar3 + iVar58)) {
                  if (iVar58 < (int)uVar47) {
                    lVar56 = 0;
                    do {
                      pMVar42->pLeaves[iVar28 + lVar56] = piVar39[iVar58 + lVar56];
                      lVar56 = lVar56 + 1;
                    } while ((ulong)uVar47 - (long)iVar58 != lVar56);
LAB_0076a628:
                    iVar28 = iVar28 + (int)lVar56;
                  }
LAB_0076a62a:
                  *(uint *)&pMVar42->field_0x10 = iVar28 << 0x1b | 0x7ffffff;
                  goto LAB_0076a638;
                }
              }
              else {
                iVar45 = 0;
                iVar28 = 0;
                if ((uint)uVar23 < 0x8000000) {
LAB_0076a5e2:
                  if ((int)(iVar28 + uVar59) <= (int)(uVar3 + iVar45)) {
                    if (iVar45 < (int)uVar59) {
                      lVar56 = 0;
                      do {
                        pMVar42->pLeaves[iVar28 + lVar56] = piVar43[iVar45 + lVar56];
                        lVar56 = lVar56 + 1;
                      } while ((ulong)uVar59 - (long)iVar45 != lVar56);
                      goto LAB_0076a628;
                    }
                    goto LAB_0076a62a;
                  }
                }
                else if ((ulong)uVar3 != 0) {
                  lVar56 = 0;
                  iVar45 = 0;
                  iVar28 = 0;
                  do {
                    iVar58 = *(int *)((long)local_1388 + (long)iVar45 * 4 + 0x14);
                    iVar50 = *(int *)((long)puVar35 + (long)iVar28 * 4 + 0x14);
                    if (iVar58 < iVar50) {
                      iVar45 = iVar45 + 1;
                      pVars[lVar56] = iVar58;
                      iVar58 = iVar28;
                      if ((int)uVar59 <= iVar45) {
LAB_0076aec0:
                        iVar28 = (int)lVar56 + 1;
                        goto LAB_0076a585;
                      }
                    }
                    else {
                      if (iVar50 < iVar58) {
                        pVars[lVar56] = iVar50;
                      }
                      else {
                        iVar45 = iVar45 + 1;
                        pVars[lVar56] = iVar58;
                        iVar58 = iVar28 + 1;
                        if ((int)uVar59 <= iVar45) goto LAB_0076aec0;
                      }
                      iVar28 = iVar28 + 1;
                      if ((int)uVar47 <= iVar28) {
                        iVar28 = (int)lVar56 + 1;
                        goto LAB_0076a5e2;
                      }
                    }
                    lVar56 = lVar56 + 1;
                  } while (uVar3 != (uint)lVar56);
                }
              }
              goto LAB_0076b1a4;
            }
            if (0x7ffffff < uVar41) {
              uVar23 = 0;
              do {
                if (piVar43[uVar23] != piVar39[uVar23]) goto LAB_0076b1a9;
                pVars[uVar23] = piVar43[uVar23];
                uVar23 = uVar23 + 1;
              } while (uVar59 != uVar23);
            }
            *(uint *)&pMVar42->field_0x10 = local_1330;
LAB_0076a638:
            pMVar42->Sign = *puVar35 | *local_1388;
            if (0 < (int)uVar48) {
              pMVar13 = local_11d8[uVar29];
              uVar41 = *(uint *)&pMVar13->field_0x10 >> 0x1b;
              uVar23 = 0;
              do {
                pMVar14 = local_11d8[uVar23];
                uVar47 = *(uint *)&pMVar14->field_0x10 >> 0x1b;
                if ((uVar47 <= uVar41) && ((pMVar14->Sign & ~pMVar13->Sign) == 0)) {
                  if (uVar41 == uVar47) {
                    if (*(uint *)&pMVar13->field_0x10 < 0x8000000) goto LAB_0076b1a4;
                    uVar24 = 0;
                    while (pMVar13->pLeaves[uVar24] == pMVar14->pLeaves[uVar24]) {
                      uVar24 = uVar24 + 1;
                      if (uVar41 == uVar24) goto LAB_0076b1a4;
                    }
                  }
                  else {
                    if (uVar41 <= uVar47) {
LAB_0076c43b:
                      __assert_fail("nSizeB > nSizeC",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMf.c"
                                    ,0x3a0,"int Mf_SetCutIsContainedOrder(Mf_Cut_t *, Mf_Cut_t *)");
                    }
                    if (*(uint *)&pMVar14->field_0x10 < 0x8000000) goto LAB_0076b1a4;
                    uVar24 = 0;
                    uVar59 = 0;
                    do {
                      if (pMVar14->pLeaves[(int)uVar59] < pMVar13->pLeaves[uVar24]) break;
                      if ((pMVar13->pLeaves[uVar24] == pMVar14->pLeaves[(int)uVar59]) &&
                         (uVar59 = uVar59 + 1, uVar59 == uVar47)) goto LAB_0076b1a4;
                      uVar24 = uVar24 + 1;
                    } while (uVar41 != uVar24);
                  }
                }
                uVar23 = uVar23 + 1;
              } while (uVar23 != uVar29);
            }
            p->CutCount[2] = p->CutCount[2] + 1.0;
            pJVar10 = p->pPars;
            if (pJVar10->fCutMin == 0) goto LAB_0076b0c1;
            if (pJVar10->nLutSize < 7) {
              pVVar15 = p->vTtMem;
              uVar41 = (uint)local_1388[2];
              uVar47 = uVar41 >> 1 & 0x3ffffff;
              if (pVVar15->nEntries <= (int)uVar47) goto LAB_0076c41c;
              uVar59 = (uint)puVar35[2];
              uVar49 = uVar59 >> 1 & 0x3ffffff;
              if (pVVar15->nEntries <= (int)uVar49) goto LAB_0076c41c;
              uVar22 = *(uint *)&pMVar42->field_0x10;
              bVar27 = (byte)pVVar15->LogPageSze;
              uVar4 = uVar22 >> 0x1b;
              uVar23 = (ulong)uVar4;
              uVar29 = -(ulong)((uVar41 & 1) != uVar46) ^
                       pVVar15->ppPages[uVar47 >> (bVar27 & 0x1f)]
                       [(int)((uVar47 & pVVar15->PageMask) * pVVar15->nEntrySize)];
              uVar24 = -(ulong)((uVar59 & 1) != uVar40) ^
                       pVVar15->ppPages[uVar49 >> (bVar27 & 0x1f)]
                       [(int)((pVVar15->PageMask & uVar49) * pVVar15->nEntrySize)];
              uVar47 = (uVar41 >> 0x1b) - 1;
              if (0x7ffffff < uVar41 && 0x7ffffff < uVar22) {
                lVar56 = uVar23 * 0x18 + 0xa2e7d8;
                uVar30 = uVar23;
                do {
                  uVar44 = uVar30 - 1;
                  iVar58 = *(int *)((long)local_1388 + (ulong)uVar47 * 4 + 0x14);
                  if (pMVar42->pLeaves[uVar30 - 1] <= iVar58) {
                    if (pMVar42->pLeaves[uVar30 - 1] != iVar58) goto LAB_0076c3de;
                    if ((long)(int)uVar47 < (long)uVar44) {
                      bVar27 = (char)(-1 << ((byte)uVar47 & 0x1f)) +
                               (char)(1 << ((byte)uVar44 & 0x1f));
                      lVar36 = (ulong)uVar47 * 0x90;
                      uVar29 = (uVar29 & *(ulong *)(lVar56 + lVar36)) >> (bVar27 & 0x3f) |
                               (*(ulong *)(lVar56 + -8 + lVar36) & uVar29) << (bVar27 & 0x3f) |
                               *(ulong *)(lVar56 + -0x10 + lVar36) & uVar29;
                    }
                    uVar47 = uVar47 - 1;
                  }
                } while ((1 < (long)uVar30) &&
                        (lVar56 = lVar56 + -0x18, uVar30 = uVar44, -1 < (int)uVar47));
              }
              if (uVar47 != 0xffffffff) {
LAB_0076c479:
                __assert_fail("k == -1",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                              ,0x732,"word Abc_Tt6Expand(word, int *, int, int *, int)");
              }
              uVar41 = (uVar59 >> 0x1b) - 1;
              if (0x7ffffff < uVar59 && 0x7ffffff < uVar22) {
                lVar56 = uVar23 * 0x18 + 0xa2e7d8;
                uVar30 = uVar23;
                do {
                  uVar44 = uVar30 - 1;
                  iVar58 = *(int *)((long)puVar35 + (ulong)uVar41 * 4 + 0x14);
                  if (pMVar42->pLeaves[uVar30 - 1] <= iVar58) {
                    if (pMVar42->pLeaves[uVar30 - 1] != iVar58) {
LAB_0076c3de:
                      __assert_fail("pCut[i] == pCut0[k]",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                                    ,0x72d,"word Abc_Tt6Expand(word, int *, int, int *, int)");
                    }
                    if ((long)(int)uVar41 < (long)uVar44) {
                      bVar27 = (char)(-1 << ((byte)uVar41 & 0x1f)) +
                               (char)(1 << ((byte)uVar44 & 0x1f));
                      lVar36 = (ulong)uVar41 * 0x90;
                      uVar24 = (uVar24 & *(ulong *)(lVar56 + lVar36)) >> (bVar27 & 0x3f) |
                               (*(ulong *)(lVar56 + -8 + lVar36) & uVar24) << (bVar27 & 0x3f) |
                               *(ulong *)(lVar56 + -0x10 + lVar36) & uVar24;
                    }
                    uVar41 = uVar41 - 1;
                  }
                } while ((1 < (long)uVar30) &&
                        (lVar56 = lVar56 + -0x18, uVar30 = uVar44, -1 < (int)uVar41));
              }
              if (uVar41 != 0xffffffff) goto LAB_0076c479;
              uVar30 = uVar24 & uVar29;
              if ((bVar62 && -1 < (int)uVar54) && bVar61) {
                uVar30 = uVar24 ^ uVar29;
              }
              uVar41 = (uint)uVar30 & 1;
              uVar30 = -(ulong)uVar41 ^ uVar30;
              local_1038[0] = uVar30;
              if (pJVar10->fCnfObjIds == 0) {
                uVar47 = 0;
                uVar29 = uVar30;
                if (0x7ffffff < uVar22) {
                  uVar24 = 0;
                  lVar56 = 0xa2e7e8;
                  pwVar53 = s_Truths6Neg;
                  uVar47 = 0;
                  do {
                    bVar27 = (byte)(1 << ((byte)uVar24 & 0x1f));
                    if ((*pwVar53 & (uVar29 >> (bVar27 & 0x3f) ^ uVar29)) != 0) {
                      lVar36 = (long)(int)uVar47;
                      if (lVar36 < (long)uVar24) {
                        pVars[lVar36] = pVars[uVar24];
                        bVar27 = (char)(-1 << ((byte)uVar47 & 0x1f)) + bVar27;
                        lVar36 = lVar36 * 0x90;
                        uVar29 = (uVar29 & *(ulong *)(lVar56 + 8 + lVar36)) >> (bVar27 & 0x3f) |
                                 (*(ulong *)(lVar56 + lVar36) & uVar29) << (bVar27 & 0x3f) |
                                 *(ulong *)(lVar56 + -8 + lVar36) & uVar29;
                      }
                      uVar47 = uVar47 + 1;
                    }
                    uVar24 = uVar24 + 1;
                    pwVar53 = pwVar53 + 1;
                    lVar56 = lVar56 + 0x18;
                  } while (uVar23 != uVar24);
                }
                if ((uVar47 != uVar4) &&
                   (uVar23 = local_12f8[0], local_1038[0] = uVar29, (int)uVar4 <= (int)uVar47)) {
LAB_0076c571:
                  local_1038[0] = uVar30;
                  local_12f8[0] = uVar23;
                  __assert_fail("k < nVars",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                                ,0x754,"int Abc_Tt6MinBase(word *, int *, int)");
                }
                *(uint *)&pMVar42->field_0x10 =
                     *(uint *)&pMVar42->field_0x10 & 0x7ffffff | uVar47 << 0x1b;
              }
              uVar23 = local_1038[0];
              if ((local_1038[0] & 1) != 0) {
                __assert_fail("(int)(t & 1) == 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMf.c"
                              ,0x22d,
                              "int Mf_CutComputeTruth6(Mf_Man_t *, Mf_Cut_t *, Mf_Cut_t *, int, int, Mf_Cut_t *, int)"
                             );
              }
              uVar47 = Vec_MemHashInsert(p->vTtMem,local_1038);
              if ((int)uVar47 < 0) {
LAB_0076c4b7:
                __assert_fail("Var >= 0 && !(c >> 1)",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                              ,0x12e,"int Abc_Var2Lit(int, int)");
              }
              uVar59 = *(uint *)&pMVar42->field_0x10;
              *(uint *)&pMVar42->field_0x10 =
                   uVar59 & 0xf8000000 | uVar41 + (uVar47 & 0x3ffffff) * 2;
              if ((p->pPars->fGenCnf != 0) && (uVar47 == (p->vCnfSizes).nSize)) {
                uVar59 = uVar59 >> 0x1b;
                local_12f8[0] = local_12f8[0] & 0xffffffff00000000;
                Abc_Tt6Isop(uVar23,uVar23,uVar59,(int *)local_12f8);
                Abc_Tt6Isop(~uVar23,~uVar23,uVar59,(int *)local_12f8);
                if (0x40 < (int)(uint)local_12f8[0]) {
LAB_0076c5af:
                  __assert_fail("nCubes <= 64",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                                ,0x96a,"int Abc_Tt6CnfSize(word, int)");
                }
                Vec_IntPush(&p->vCnfSizes,(uint)local_12f8[0]);
              }
              uVar41 = *(uint *)&pMVar42->field_0x10 >> 0x1b;
              bVar60 = uVar41 < uVar4;
              if (!bVar60 && uVar41 != uVar4) {
                __assert_fail("(int)pCutR->nLeaves <= nOldSupp",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMf.c"
                              ,0x233,
                              "int Mf_CutComputeTruth6(Mf_Man_t *, Mf_Cut_t *, Mf_Cut_t *, int, int, Mf_Cut_t *, int)"
                             );
              }
            }
            else {
              iVar58 = pJVar10->nLutSize;
              uVar41 = 1 << ((char)iVar58 - 6U & 0x1f);
              if (iVar58 < 7) {
                uVar41 = 1;
              }
              pVVar15 = p->vTtMem;
              uVar47 = (uint)local_1388[2];
              uVar59 = uVar47 >> 1 & 0x3ffffff;
              if (pVVar15->nEntries <= (int)uVar59) {
LAB_0076c41c:
                __assert_fail("i >= 0 && i < p->nEntries",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecMem.h"
                              ,0xc9,"word *Vec_MemReadEntry(Vec_Mem_t *, int)");
              }
              bVar27 = (byte)pVVar15->LogPageSze;
              uVar23 = puVar35[2];
              uVar49 = (uint)uVar23 >> 1 & 0x3ffffff;
              if (pVVar15->nEntries <= (int)uVar49) goto LAB_0076c41c;
              iVar28 = (uVar59 & pVVar15->PageMask) * pVVar15->nEntrySize;
              pwVar53 = pVVar15->ppPages[uVar59 >> (bVar27 & 0x1f)];
              iVar45 = (uVar49 & pVVar15->PageMask) * pVVar15->nEntrySize;
              pwVar17 = pVVar15->ppPages[uVar49 >> (bVar27 & 0x1f)];
              uVar59 = *(uint *)&pMVar42->field_0x10;
              if ((uVar47 & 1) == uVar46) {
                if (0 < (int)uVar41) {
                  uVar29 = 0;
                  do {
                    local_12f8[uVar29] = pwVar53[(long)iVar28 + uVar29];
                    uVar29 = uVar29 + 1;
                  } while (uVar41 != uVar29);
                }
              }
              else if (0 < (int)uVar41) {
                uVar29 = 0;
                do {
                  local_12f8[uVar29] = ~pwVar53[(long)iVar28 + uVar29];
                  uVar29 = uVar29 + 1;
                } while (uVar41 != uVar29);
              }
              if (((uint)uVar23 & 1) == uVar40) {
                if (0 < (int)uVar41) {
                  uVar23 = 0;
                  do {
                    local_1258[uVar23] = pwVar17[(long)iVar45 + uVar23];
                    uVar23 = uVar23 + 1;
                  } while (uVar41 != uVar23);
                }
              }
              else if (0 < (int)uVar41) {
                uVar23 = 0;
                do {
                  local_1258[uVar23] = ~pwVar17[(long)iVar45 + uVar23];
                  uVar23 = uVar23 + 1;
                } while (uVar41 != uVar23);
              }
              uVar49 = uVar59 >> 0x1b;
              uVar23 = (ulong)uVar49;
              uVar22 = (uVar47 >> 0x1b) - 1;
              if (0x7ffffff < uVar47 && 0x7ffffff < uVar59) {
                do {
                  uVar29 = uVar23 - 1;
                  iVar28 = *(int *)((long)local_1388 + (ulong)uVar22 * 4 + 0x14);
                  if (pMVar42->pLeaves[uVar23 - 1] <= iVar28) {
                    if (pMVar42->pLeaves[uVar23 - 1] != iVar28) goto LAB_0076c3fd;
                    if ((long)(int)uVar22 < (long)uVar29) {
                      Abc_TtSwapVars(local_12f8,iVar58,uVar22,(int)uVar29);
                    }
                    uVar22 = uVar22 - 1;
                  }
                } while ((1 < (long)uVar23) && (uVar23 = uVar29, -1 < (int)uVar22));
              }
              if (uVar22 != 0xffffffff) {
LAB_0076c498:
                __assert_fail("k == -1",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                              ,0x741,"void Abc_TtExpand(word *, int, int *, int, int *, int)");
              }
              uVar47 = ((uint)puVar35[2] >> 0x1b) - 1;
              if ((0x7ffffff < (uint)puVar35[2]) && (0x7ffffff < *(uint *)&pMVar42->field_0x10)) {
                uVar23 = (ulong)(*(uint *)&pMVar42->field_0x10 >> 0x1b);
                do {
                  uVar29 = uVar23 - 1;
                  iVar28 = *(int *)((long)puVar35 + (ulong)uVar47 * 4 + 0x14);
                  if (pMVar42->pLeaves[uVar23 - 1] <= iVar28) {
                    if (pMVar42->pLeaves[uVar23 - 1] != iVar28) {
LAB_0076c3fd:
                      __assert_fail("pCut[i] == pCut0[k]",
                                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                                    ,0x73c,"void Abc_TtExpand(word *, int, int *, int, int *, int)")
                      ;
                    }
                    if ((long)(int)uVar47 < (long)uVar29) {
                      Abc_TtSwapVars(local_1258,iVar58,uVar47,(int)uVar29);
                    }
                    uVar47 = uVar47 - 1;
                  }
                } while ((1 < (long)uVar23) && (uVar23 = uVar29, -1 < (int)uVar47));
              }
              if (uVar47 != 0xffffffff) goto LAB_0076c498;
              if ((bVar62 && -1 < (int)uVar54) && bVar61) {
                uVar47 = ((uint)local_1258[0] ^ (uint)local_12f8[0]) & 1;
                if (uVar47 == 0) {
                  if (0 < (int)uVar41) {
                    uVar23 = 0;
                    do {
                      local_1038[uVar23] = local_1258[uVar23] ^ local_12f8[uVar23];
                      uVar23 = uVar23 + 1;
                    } while (uVar41 != uVar23);
                  }
                }
                else if (0 < (int)uVar41) {
                  uVar23 = 0;
                  do {
                    local_1038[uVar23] = ~(local_12f8[uVar23] ^ local_1258[uVar23]);
                    uVar23 = uVar23 + 1;
                  } while (uVar41 != uVar23);
                }
              }
              else {
                uVar47 = (uint)local_1258[0] & (uint)local_12f8[0] & 1;
                if (uVar47 == 0) {
                  if (0 < (int)uVar41) {
                    uVar23 = 0;
                    do {
                      local_1038[uVar23] = local_1258[uVar23] & local_12f8[uVar23];
                      uVar23 = uVar23 + 1;
                    } while (uVar41 != uVar23);
                  }
                }
                else if (0 < (int)uVar41) {
                  uVar23 = 0;
                  do {
                    local_1038[uVar23] = ~(local_1258[uVar23] & local_12f8[uVar23]);
                    uVar23 = uVar23 + 1;
                  } while (uVar41 != uVar23);
                }
              }
              iVar28 = Abc_TtMinBase(local_1038,pVars,*(uint *)&pMVar42->field_0x10 >> 0x1b,iVar58);
              *(uint *)&pMVar42->field_0x10 =
                   *(uint *)&pMVar42->field_0x10 & 0x7ffffff | iVar28 << 0x1b;
              if ((local_1038[0] & 1) != 0) {
                __assert_fail("(uTruth[0] & 1) == 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMf.c"
                              ,0x24b,
                              "int Mf_CutComputeTruth(Mf_Man_t *, Mf_Cut_t *, Mf_Cut_t *, int, int, Mf_Cut_t *, int)"
                             );
              }
              uVar41 = Vec_MemHashInsert(p->vTtMem,local_1038);
              if ((int)uVar41 < 0) goto LAB_0076c4b7;
              uVar59 = *(uint *)&pMVar42->field_0x10;
              *(uint *)&pMVar42->field_0x10 =
                   uVar59 & 0xf8000000 | uVar47 + (uVar41 & 0x3ffffff) * 2;
              if (((p->pPars->fGenCnf != 0) && (iVar58 < 9)) && (uVar41 == (p->vCnfSizes).nSize)) {
                uVar59 = uVar59 >> 0x1b;
                local_1158[0] = ~local_1038[0];
                local_1158[1] = ~local_1038[1];
                local_1158[2] = ~CONCAT44(uStack_1024,local_1028);
                local_1158[3] = ~uStack_1020;
                iVar58 = Abc_Tt8Isop(local_1038,local_1038,uVar59,local_10d8);
                iVar28 = Abc_Tt8Isop(local_1158,local_1158,uVar59,local_10d8);
                if (0x100 < iVar28 + iVar58) {
LAB_0076c590:
                  __assert_fail("nCubes <= 256",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                                ,0x973,"int Abc_Tt8CnfSize(word *, int)");
                }
                Vec_IntPush(&p->vCnfSizes,iVar28 + iVar58);
              }
              uVar41 = *(uint *)&pMVar42->field_0x10 >> 0x1b;
              bVar60 = uVar41 < uVar49;
              if (!bVar60 && uVar41 != uVar49) {
                __assert_fail("(int)pCutR->nLeaves <= nOldSupp",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMf.c"
                              ,0x251,
                              "int Mf_CutComputeTruth(Mf_Man_t *, Mf_Cut_t *, Mf_Cut_t *, int, int, Mf_Cut_t *, int)"
                             );
              }
            }
            if (bVar60) {
              if (*(uint *)&pMVar42->field_0x10 < 0x8000000) {
                uVar23 = 0;
              }
              else {
                uVar29 = 0;
                uVar23 = 0;
                do {
                  uVar23 = uVar23 | 1L << ((ulong)(byte)pVars[uVar29] & 0x3f);
                  uVar29 = uVar29 + 1;
                } while (*(uint *)&pMVar42->field_0x10 >> 0x1b != uVar29);
              }
              pMVar42->Sign = uVar23;
            }
LAB_0076b0c1:
            uVar41 = *(uint *)&pMVar42->field_0x10;
            uVar47 = uVar41 >> 0x1b;
            pJVar10 = p->pPars;
            if (pJVar10->nLutSize < (int)uVar47) goto LAB_0076c45a;
            fVar1 = pMVar7->nFlowRefs;
            pMVar42->Delay = 0;
            pMVar42->Flow = 0.0;
            if (0x7ffffff < uVar41) {
              pMVar11 = p->pLfObjs;
              uVar23 = 0;
              fVar63 = 0.0;
              uVar59 = 0;
              do {
                iVar58 = pMVar42->pLeaves[uVar23];
                uVar2 = *(ushort *)&pMVar11[iVar58].field_0xc;
                if (uVar59 <= uVar2) {
                  uVar59 = (uint)uVar2;
                }
                pMVar42->Delay = uVar59;
                fVar63 = fVar63 + pMVar11[iVar58].Flow;
                pMVar42->Flow = fVar63;
                uVar23 = uVar23 + 1;
              } while (uVar47 != uVar23);
            }
            pMVar42->Delay = (pMVar42->Delay + 1) - (uint)(uVar41 < 0x10000000);
            if (uVar41 < 0x10000000) {
              iVar58 = 0;
            }
            else if (pJVar10->fGenCnf == 0) {
              if (pJVar10->fOptEdge == 0) {
                iVar58 = 1;
              }
              else {
                iVar58 = uVar47 + pJVar10->nAreaTuner;
              }
            }
            else {
              uVar41 = uVar41 >> 1 & 0x3ffffff;
              if ((p->vCnfSizes).nSize <= (int)uVar41) goto LAB_0076c4d6;
              iVar58 = (p->vCnfSizes).pArray[uVar41];
            }
            pMVar42->Flow = (pMVar42->Flow + (float)iVar58) / fVar1;
            uVar48 = Mf_SetAddCut(local_11d8,uVar48,nCutNum);
LAB_0076b1a4:
            uVar29 = (ulong)uVar48;
LAB_0076b1a9:
            puVar35 = puVar35 + 8;
            piVar39 = piVar39 + 0x10;
          } while (puVar35 < local_c38 + (long)iVar31 * 8);
        }
        local_1388 = local_1388 + 8;
        piVar43 = piVar43 + 0x10;
      } while (local_1388 < local_838 + (long)iVar34 * 8);
    }
  }
  else {
    puVar38 = p->pGia->pMuxes;
    uVar54 = 0xffffffff;
    if (puVar38 != (uint *)0x0) {
      uVar41 = puVar38[(uint)iObj];
      if (uVar41 != 0) {
        if ((int)uVar41 < 0) {
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                        ,0x12f,"int Abc_Lit2Var(int)");
        }
        uVar54 = uVar41 >> 1;
      }
    }
    iVar58 = p->pLfObjs[(int)uVar54].iCutSet;
    if (iVar58 == 0) {
      local_1038[1] = 0;
      local_1028 = 0x8000002;
      uStack_1024 = uVar54;
      local_1038[0] = 1L << ((byte)uVar54 & 0x3f);
      iVar28 = 1;
    }
    else {
      uVar41 = iVar58 >> 0x10;
      if (((int)uVar41 < 0) || ((p->vPages).nSize <= (int)uVar41)) goto LAB_0076c64a;
      pvVar25 = (p->vPages).pArray[uVar41];
      iVar28 = *(int *)((long)pvVar25 + (ulong)(ushort)iVar58 * 4);
      if (iVar28 < 1) {
        puVar35 = local_1038;
      }
      else {
        piVar43 = (int *)((long)pvVar25 + (ulong)(ushort)iVar58 * 4);
        puVar38 = (uint *)(piVar43 + 1);
        puVar35 = local_1038;
        iVar58 = 0;
        do {
          puVar35[1] = 0;
          uVar41 = *puVar38;
          *(uint *)(puVar35 + 2) = (uint)puVar35[2] & 0xf8000000 | uVar41 >> 5;
          *(uint *)(puVar35 + 2) = *puVar38 << 0x1b | uVar41 >> 5;
          uVar41 = *puVar38 & 0x1f;
          if (uVar41 == 0) {
            uVar23 = 0;
          }
          else {
            uVar24 = 0;
            uVar23 = 0;
            do {
              uVar23 = uVar23 | 1L << ((ulong)(byte)(puVar38 + 1)[uVar24] & 0x3f);
              uVar24 = uVar24 + 1;
            } while (uVar41 != uVar24);
          }
          *puVar35 = uVar23;
          memcpy((void *)((long)puVar35 + 0x14),puVar38 + 1,(ulong)(uVar41 << 2));
          puVar35 = puVar35 + 8;
          iVar58 = iVar58 + 1;
          puVar38 = puVar38 + (ulong)(*puVar38 & 0x1f) + 1;
          iVar28 = *piVar43;
        } while (iVar58 < iVar28);
      }
      if (0xfffffff < local_1028) {
        puVar35[1] = 0;
        *(undefined4 *)(puVar35 + 2) = 0x8000002;
        *(uint *)((long)puVar35 + 0x14) = uVar54;
        *puVar35 = 1L << ((byte)uVar54 & 0x3f);
        iVar28 = iVar28 + 1;
      }
    }
    pGVar8 = p->pGia;
    if (pGVar8->pMuxes == (uint *)0x0) {
      uVar54 = 0;
    }
    else {
      pGVar12 = pGVar8->pObjs;
      if ((pGVar6 < pGVar12) || (pGVar12 + pGVar8->nObjs <= pGVar6)) {
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      uVar54 = pGVar8->pMuxes[(int)((ulong)((long)pGVar6 - (long)pGVar12) >> 2) * -0x55555555];
      if ((int)uVar54 < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                      ,0x130,"int Abc_LitIsCompl(int)");
      }
      uVar54 = uVar54 & 1;
    }
    p->CutCount[0] = (double)(iVar31 * iVar34 * iVar28) + p->CutCount[0];
    if (0 < iVar34) {
      puVar35 = local_838;
      do {
        if (0 < iVar31) {
          local_1380 = local_c38;
          do {
            if (0 < iVar28) {
              puVar57 = local_1038;
              do {
                uVar23 = *local_1380 | *puVar35 | *puVar57;
                uVar23 = uVar23 - (uVar23 >> 1 & 0x5555555555555555);
                uVar23 = (uVar23 >> 2 & 0x3333333333333333) + (uVar23 & 0x3333333333333333);
                if ((int)(uint)(byte)(((uVar23 >> 4) + uVar23 & 0xf0f0f0f0f0f0f0f) *
                                      0x101010101010101 >> 0x38) <= (int)uVar3) {
                  p->CutCount[1] = p->CutCount[1] + 1.0;
                  iVar45 = (int)uVar29;
                  pMVar42 = local_11d8[iVar45];
                  uVar23 = puVar35[2];
                  uVar24 = local_1380[2];
                  uVar30 = puVar57[2];
                  piVar43 = pMVar42->pLeaves;
                  uVar44 = 0;
                  iVar58 = 0x7ffffff;
                  uVar33 = 0;
                  uVar41 = 0;
                  uVar47 = 0;
                  while( true ) {
                    iVar32 = 1000000000;
                    iVar50 = 1000000000;
                    if (uVar47 != (uint)uVar23 >> 0x1b) {
                      iVar50 = *(int *)((long)puVar35 + (ulong)uVar47 * 4 + 0x14);
                    }
                    if (uVar41 != (uint)uVar24 >> 0x1b) {
                      iVar32 = *(int *)((long)local_1380 + (ulong)uVar41 * 4 + 0x14);
                    }
                    iVar52 = 1000000000;
                    if ((uint)uVar33 != (uint)uVar30 >> 0x1b) {
                      iVar52 = *(int *)((long)puVar57 + uVar33 * 4 + 0x14);
                    }
                    iVar51 = iVar32;
                    if (iVar50 < iVar32) {
                      iVar51 = iVar50;
                    }
                    iVar55 = iVar52;
                    if (iVar51 < iVar52) {
                      iVar55 = iVar51;
                    }
                    if (iVar55 == 1000000000) break;
                    if (uVar3 == uVar44) goto LAB_0076b4fe;
                    pMVar42->pLeaves[uVar44] = iVar55;
                    uVar44 = uVar44 + 1;
                    uVar47 = uVar47 + (iVar50 == iVar55);
                    uVar41 = uVar41 + (iVar32 == iVar55);
                    uVar33 = (ulong)((uint)uVar33 + (uint)(iVar52 <= iVar51));
                    iVar58 = iVar58 + 0x8000000;
                  }
                  *(int *)&pMVar42->field_0x10 = iVar58;
                  pMVar42->Sign = *local_1380 | *puVar35 | *puVar57;
LAB_0076b4fe:
                  if (iVar55 == 1000000000) {
                    if (0 < iVar45) {
                      pMVar13 = local_11d8[uVar29];
                      uVar41 = *(uint *)&pMVar13->field_0x10 >> 0x1b;
                      uVar23 = 0;
                      do {
                        pMVar14 = local_11d8[uVar23];
                        uVar47 = *(uint *)&pMVar14->field_0x10 >> 0x1b;
                        if ((uVar47 <= uVar41) && ((pMVar14->Sign & ~pMVar13->Sign) == 0)) {
                          if (uVar41 == uVar47) {
                            if (*(uint *)&pMVar13->field_0x10 < 0x8000000) goto LAB_0076c18f;
                            uVar24 = 0;
                            while (pMVar13->pLeaves[uVar24] == pMVar14->pLeaves[uVar24]) {
                              uVar24 = uVar24 + 1;
                              if (uVar41 == uVar24) goto LAB_0076c18f;
                            }
                          }
                          else {
                            if (uVar41 <= uVar47) goto LAB_0076c43b;
                            if (*(uint *)&pMVar14->field_0x10 < 0x8000000) goto LAB_0076c18f;
                            uVar24 = 0;
                            uVar59 = 0;
                            do {
                              if (pMVar14->pLeaves[(int)uVar59] < pMVar13->pLeaves[uVar24]) break;
                              if ((pMVar13->pLeaves[uVar24] == pMVar14->pLeaves[(int)uVar59]) &&
                                 (uVar59 = uVar59 + 1, uVar59 == uVar47)) goto LAB_0076c18f;
                              uVar24 = uVar24 + 1;
                            } while (uVar41 != uVar24);
                          }
                        }
                        uVar23 = uVar23 + 1;
                      } while (uVar23 != uVar29);
                    }
                    p->CutCount[2] = p->CutCount[2] + 1.0;
                    pJVar10 = p->pPars;
                    if (pJVar10->fCutMin != 0) {
                      if (pJVar10->nLutSize < 7) {
                        pVVar15 = p->vTtMem;
                        uVar41 = (uint)puVar35[2];
                        uVar47 = uVar41 >> 1 & 0x3ffffff;
                        iVar58 = pVVar15->nEntries;
                        if (iVar58 <= (int)uVar47) goto LAB_0076c41c;
                        bVar27 = (byte)pVVar15->LogPageSze;
                        uVar59 = (uint)local_1380[2];
                        uVar48 = uVar59 >> 1 & 0x3ffffff;
                        if (iVar58 <= (int)uVar48) goto LAB_0076c41c;
                        uVar49 = (uint)puVar57[2];
                        uVar22 = uVar49 >> 1 & 0x3ffffff;
                        if (iVar58 <= (int)uVar22) goto LAB_0076c41c;
                        uVar4 = *(uint *)&pMVar42->field_0x10;
                        uVar37 = uVar4 >> 0x1b;
                        uVar29 = (ulong)uVar37;
                        ppwVar16 = pVVar15->ppPages;
                        iVar58 = pVVar15->nEntrySize;
                        uVar5 = pVVar15->PageMask;
                        uVar23 = -(ulong)((uVar41 & 1) != uVar46) ^
                                 ppwVar16[uVar47 >> (bVar27 & 0x1f)]
                                 [(int)((uVar47 & uVar5) * iVar58)];
                        uVar24 = -(ulong)((uVar59 & 1) != uVar40) ^
                                 ppwVar16[uVar48 >> (bVar27 & 0x1f)]
                                 [(int)((uVar48 & uVar5) * iVar58)];
                        uVar30 = -(ulong)((uVar49 & 1) != uVar54) ^
                                 ppwVar16[uVar22 >> (bVar27 & 0x1f)]
                                 [(int)((uVar22 & uVar5) * iVar58)];
                        uVar47 = (uVar41 >> 0x1b) - 1;
                        if (0x7ffffff < uVar41 && 0x7ffffff < uVar4) {
                          lVar56 = uVar29 * 0x18 + 0xa2e7d8;
                          uVar44 = uVar29;
                          do {
                            uVar33 = uVar44 - 1;
                            iVar58 = *(int *)((long)puVar35 + (ulong)uVar47 * 4 + 0x14);
                            if (pMVar42->pLeaves[uVar44 - 1] <= iVar58) {
                              if (pMVar42->pLeaves[uVar44 - 1] != iVar58) goto LAB_0076c3de;
                              if ((long)(int)uVar47 < (long)uVar33) {
                                bVar27 = (char)(-1 << ((byte)uVar47 & 0x1f)) +
                                         (char)(1 << ((byte)uVar33 & 0x1f));
                                lVar36 = (ulong)uVar47 * 0x90;
                                uVar23 = (uVar23 & *(ulong *)(lVar56 + lVar36)) >> (bVar27 & 0x3f) |
                                         (*(ulong *)(lVar56 + -8 + lVar36) & uVar23) <<
                                         (bVar27 & 0x3f) |
                                         *(ulong *)(lVar56 + -0x10 + lVar36) & uVar23;
                              }
                              uVar47 = uVar47 - 1;
                            }
                          } while ((1 < (long)uVar44) &&
                                  (lVar56 = lVar56 + -0x18, uVar44 = uVar33, -1 < (int)uVar47));
                        }
                        if (uVar47 != 0xffffffff) goto LAB_0076c479;
                        uVar41 = (uVar59 >> 0x1b) - 1;
                        if (0x7ffffff < uVar59 && 0x7ffffff < uVar4) {
                          lVar56 = uVar29 * 0x18 + 0xa2e7d8;
                          uVar44 = uVar29;
                          do {
                            uVar33 = uVar44 - 1;
                            iVar58 = *(int *)((long)local_1380 + (ulong)uVar41 * 4 + 0x14);
                            if (pMVar42->pLeaves[uVar44 - 1] <= iVar58) {
                              if (pMVar42->pLeaves[uVar44 - 1] != iVar58) goto LAB_0076c3de;
                              if ((long)(int)uVar41 < (long)uVar33) {
                                bVar27 = (char)(-1 << ((byte)uVar41 & 0x1f)) +
                                         (char)(1 << ((byte)uVar33 & 0x1f));
                                lVar36 = (ulong)uVar41 * 0x90;
                                uVar24 = (uVar24 & *(ulong *)(lVar56 + lVar36)) >> (bVar27 & 0x3f) |
                                         (*(ulong *)(lVar56 + -8 + lVar36) & uVar24) <<
                                         (bVar27 & 0x3f) |
                                         *(ulong *)(lVar56 + -0x10 + lVar36) & uVar24;
                              }
                              uVar41 = uVar41 - 1;
                            }
                          } while ((1 < (long)uVar44) &&
                                  (lVar56 = lVar56 + -0x18, uVar44 = uVar33, -1 < (int)uVar41));
                        }
                        if (uVar41 != 0xffffffff) goto LAB_0076c479;
                        uVar41 = (uVar49 >> 0x1b) - 1;
                        if (0x7ffffff < uVar49 && 0x7ffffff < uVar4) {
                          lVar56 = uVar29 * 0x18 + 0xa2e7d8;
                          uVar44 = uVar29;
                          do {
                            uVar33 = uVar44 - 1;
                            iVar58 = *(int *)((long)puVar57 + (ulong)uVar41 * 4 + 0x14);
                            if (pMVar42->pLeaves[uVar44 - 1] <= iVar58) {
                              if (pMVar42->pLeaves[uVar44 - 1] != iVar58) goto LAB_0076c3de;
                              if ((long)(int)uVar41 < (long)uVar33) {
                                bVar27 = (char)(-1 << ((byte)uVar41 & 0x1f)) +
                                         (char)(1 << ((byte)uVar33 & 0x1f));
                                lVar36 = (ulong)uVar41 * 0x90;
                                uVar30 = (uVar30 & *(ulong *)(lVar56 + lVar36)) >> (bVar27 & 0x3f) |
                                         (*(ulong *)(lVar56 + -8 + lVar36) & uVar30) <<
                                         (bVar27 & 0x3f) |
                                         *(ulong *)(lVar56 + -0x10 + lVar36) & uVar30;
                              }
                              uVar41 = uVar41 - 1;
                            }
                          } while ((1 < (long)uVar44) &&
                                  (lVar56 = lVar56 + -0x18, uVar44 = uVar33, -1 < (int)uVar41));
                        }
                        if (uVar41 != 0xffffffff) goto LAB_0076c479;
                        uVar23 = (uVar24 ^ uVar23) & uVar30 ^ uVar23;
                        uVar47 = (uint)uVar23 & 1;
                        uVar23 = -(ulong)uVar47 ^ uVar23;
                        uVar41 = 0;
                        uVar24 = uVar23;
                        if (0x7ffffff < uVar4) {
                          uVar30 = 0;
                          lVar56 = 0xa2e7e8;
                          pwVar53 = s_Truths6Neg;
                          uVar41 = 0;
                          do {
                            bVar27 = (byte)(1 << ((byte)uVar30 & 0x1f));
                            if ((*pwVar53 & (uVar24 >> (bVar27 & 0x3f) ^ uVar24)) != 0) {
                              lVar36 = (long)(int)uVar41;
                              if (lVar36 < (long)uVar30) {
                                piVar43[lVar36] = piVar43[uVar30];
                                bVar27 = (char)(-1 << ((byte)uVar41 & 0x1f)) + bVar27;
                                lVar36 = lVar36 * 0x90;
                                uVar24 = (uVar24 & *(ulong *)(lVar56 + 8 + lVar36)) >>
                                         (bVar27 & 0x3f) |
                                         (*(ulong *)(lVar56 + lVar36) & uVar24) << (bVar27 & 0x3f) |
                                         *(ulong *)(lVar56 + -8 + lVar36) & uVar24;
                              }
                              uVar41 = uVar41 + 1;
                            }
                            uVar30 = uVar30 + 1;
                            pwVar53 = pwVar53 + 1;
                            lVar56 = lVar56 + 0x18;
                          } while (uVar29 != uVar30);
                        }
                        local_12f8[0] = uVar23;
                        if ((uVar41 != uVar37) &&
                           (local_12f8[0] = uVar24, uVar30 = local_1038[0],
                           (int)uVar37 <= (int)uVar41)) goto LAB_0076c571;
                        uVar23 = local_12f8[0];
                        *(uint *)&pMVar42->field_0x10 =
                             *(uint *)&pMVar42->field_0x10 & 0x7ffffff | uVar41 << 0x1b;
                        if ((local_12f8[0] & 1) != 0) {
                          __assert_fail("(int)(t & 1) == 0",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMf.c"
                                        ,0x264,
                                        "int Mf_CutComputeTruthMux6(Mf_Man_t *, Mf_Cut_t *, Mf_Cut_t *, Mf_Cut_t *, int, int, int, Mf_Cut_t *)"
                                       );
                        }
                        uVar41 = Vec_MemHashInsert(p->vTtMem,local_12f8);
                        if ((int)uVar41 < 0) goto LAB_0076c4b7;
                        uVar59 = *(uint *)&pMVar42->field_0x10;
                        *(uint *)&pMVar42->field_0x10 =
                             uVar59 & 0xf8000000 | uVar47 + (uVar41 & 0x3ffffff) * 2;
                        if ((p->pPars->fGenCnf != 0) && (uVar41 == (p->vCnfSizes).nSize)) {
                          uVar59 = uVar59 >> 0x1b;
                          local_1258[0]._0_4_ = 0;
                          Abc_Tt6Isop(uVar23,uVar23,uVar59,(int *)local_1258);
                          Abc_Tt6Isop(~uVar23,~uVar23,uVar59,(int *)local_1258);
                          if (0x40 < (int)(uint)local_1258[0]) goto LAB_0076c5af;
                          Vec_IntPush(&p->vCnfSizes,(uint)local_1258[0]);
                        }
                        uVar41 = *(uint *)&pMVar42->field_0x10 >> 0x1b;
                        bVar61 = uVar41 < uVar37;
                        if (uVar37 < uVar41) {
                          __assert_fail("(int)pCutR->nLeaves <= nOldSupp",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMf.c"
                                        ,0x269,
                                        "int Mf_CutComputeTruthMux6(Mf_Man_t *, Mf_Cut_t *, Mf_Cut_t *, Mf_Cut_t *, int, int, int, Mf_Cut_t *)"
                                       );
                        }
                      }
                      else {
                        iVar58 = pJVar10->nLutSize;
                        uVar41 = 1 << ((char)iVar58 - 6U & 0x1f);
                        if (iVar58 < 7) {
                          uVar41 = 1;
                        }
                        uVar23 = (ulong)uVar41;
                        pVVar15 = p->vTtMem;
                        uVar47 = (uint)puVar35[2];
                        uVar59 = uVar47 >> 1 & 0x3ffffff;
                        iVar50 = pVVar15->nEntries;
                        if (iVar50 <= (int)uVar59) goto LAB_0076c41c;
                        bVar27 = (byte)pVVar15->LogPageSze;
                        uVar29 = local_1380[2];
                        uVar48 = (uint)uVar29 >> 1 & 0x3ffffff;
                        if (iVar50 <= (int)uVar48) goto LAB_0076c41c;
                        uVar24 = puVar57[2];
                        uVar49 = (uint)uVar24 >> 1 & 0x3ffffff;
                        if (iVar50 <= (int)uVar49) goto LAB_0076c41c;
                        ppwVar16 = pVVar15->ppPages;
                        iVar50 = pVVar15->nEntrySize;
                        uVar22 = pVVar15->PageMask;
                        iVar32 = (uVar59 & uVar22) * iVar50;
                        pwVar53 = ppwVar16[uVar59 >> (bVar27 & 0x1f)];
                        iVar52 = (uVar48 & uVar22) * iVar50;
                        pwVar17 = ppwVar16[uVar48 >> (bVar27 & 0x1f)];
                        iVar50 = (uVar49 & uVar22) * iVar50;
                        pwVar18 = ppwVar16[uVar49 >> (bVar27 & 0x1f)];
                        uVar59 = *(uint *)&pMVar42->field_0x10;
                        if ((uVar47 & 1) == uVar46) {
                          if (0 < (int)uVar41) {
                            uVar30 = 0;
                            do {
                              local_1258[uVar30] = pwVar53[(long)iVar32 + uVar30];
                              uVar30 = uVar30 + 1;
                            } while (uVar23 != uVar30);
                          }
                        }
                        else if (0 < (int)uVar41) {
                          uVar30 = 0;
                          do {
                            local_1258[uVar30] = ~pwVar53[(long)iVar32 + uVar30];
                            uVar30 = uVar30 + 1;
                          } while (uVar23 != uVar30);
                        }
                        if (((uint)uVar29 & 1) == uVar40) {
                          if (0 < (int)uVar41) {
                            uVar29 = 0;
                            do {
                              local_10d8[uVar29] = pwVar17[(long)iVar52 + uVar29];
                              uVar29 = uVar29 + 1;
                            } while (uVar23 != uVar29);
                          }
                        }
                        else if (0 < (int)uVar41) {
                          uVar29 = 0;
                          do {
                            local_10d8[uVar29] = ~pwVar17[(long)iVar52 + uVar29];
                            uVar29 = uVar29 + 1;
                          } while (uVar23 != uVar29);
                        }
                        if (((uint)uVar24 & 1) == uVar54) {
                          if (0 < (int)uVar41) {
                            uVar29 = 0;
                            do {
                              local_1158[uVar29] = pwVar18[(long)iVar50 + uVar29];
                              uVar29 = uVar29 + 1;
                            } while (uVar41 != uVar29);
                          }
                        }
                        else if (0 < (int)uVar41) {
                          uVar29 = 0;
                          do {
                            local_1158[uVar29] = ~pwVar18[(long)iVar50 + uVar29];
                            uVar29 = uVar29 + 1;
                          } while (uVar23 != uVar29);
                        }
                        uVar48 = uVar59 >> 0x1b;
                        uVar29 = (ulong)uVar48;
                        uVar49 = (uVar47 >> 0x1b) - 1;
                        if (0x7ffffff < uVar47 && 0x7ffffff < uVar59) {
                          do {
                            uVar24 = uVar29 - 1;
                            iVar50 = *(int *)((long)puVar35 + (ulong)uVar49 * 4 + 0x14);
                            if (pMVar42->pLeaves[uVar29 - 1] <= iVar50) {
                              if (pMVar42->pLeaves[uVar29 - 1] != iVar50) goto LAB_0076c3fd;
                              if ((long)(int)uVar49 < (long)uVar24) {
                                Abc_TtSwapVars(local_1258,iVar58,uVar49,(int)uVar24);
                              }
                              uVar49 = uVar49 - 1;
                            }
                          } while ((1 < (long)uVar29) && (uVar29 = uVar24, -1 < (int)uVar49));
                        }
                        if (uVar49 != 0xffffffff) goto LAB_0076c498;
                        uVar47 = ((uint)local_1380[2] >> 0x1b) - 1;
                        if ((0x7ffffff < (uint)local_1380[2]) &&
                           (0x7ffffff < *(uint *)&pMVar42->field_0x10)) {
                          uVar29 = (ulong)(*(uint *)&pMVar42->field_0x10 >> 0x1b);
                          do {
                            uVar24 = uVar29 - 1;
                            iVar50 = *(int *)((long)local_1380 + (ulong)uVar47 * 4 + 0x14);
                            if (pMVar42->pLeaves[uVar29 - 1] <= iVar50) {
                              if (pMVar42->pLeaves[uVar29 - 1] != iVar50) goto LAB_0076c3fd;
                              if ((long)(int)uVar47 < (long)uVar24) {
                                Abc_TtSwapVars(local_10d8,iVar58,uVar47,(int)uVar24);
                              }
                              uVar47 = uVar47 - 1;
                            }
                          } while ((1 < (long)uVar29) && (uVar29 = uVar24, -1 < (int)uVar47));
                        }
                        if (uVar47 != 0xffffffff) goto LAB_0076c498;
                        uVar47 = ((uint)puVar57[2] >> 0x1b) - 1;
                        if ((0x7ffffff < (uint)puVar57[2]) &&
                           (0x7ffffff < *(uint *)&pMVar42->field_0x10)) {
                          uVar29 = (ulong)(*(uint *)&pMVar42->field_0x10 >> 0x1b);
                          do {
                            uVar24 = uVar29 - 1;
                            iVar50 = *(int *)((long)puVar57 + (ulong)uVar47 * 4 + 0x14);
                            if (pMVar42->pLeaves[uVar29 - 1] <= iVar50) {
                              if (pMVar42->pLeaves[uVar29 - 1] != iVar50) goto LAB_0076c3fd;
                              if ((long)(int)uVar47 < (long)uVar24) {
                                Abc_TtSwapVars(local_1158,iVar58,uVar47,(int)uVar24);
                              }
                              uVar47 = uVar47 - 1;
                            }
                          } while ((1 < (long)uVar29) && (uVar29 = uVar24, -1 < (int)uVar47));
                        }
                        if (uVar47 != 0xffffffff) goto LAB_0076c498;
                        if (0 < (int)uVar41) {
                          uVar29 = 0;
                          do {
                            local_12f8[uVar29] =
                                 (local_10d8[uVar29] ^ local_1258[uVar29]) & local_1158[uVar29] ^
                                 local_1258[uVar29];
                            uVar29 = uVar29 + 1;
                          } while (uVar23 != uVar29);
                        }
                        uVar47 = (uint)local_12f8[0] & 1;
                        if ((local_12f8[0] & 1) != 0 && 0 < (int)uVar41) {
                          uVar29 = 0;
                          do {
                            local_12f8[uVar29] = ~local_12f8[uVar29];
                            uVar29 = uVar29 + 1;
                          } while (uVar23 != uVar29);
                        }
                        iVar50 = Abc_TtMinBase(local_12f8,piVar43,
                                               *(uint *)&pMVar42->field_0x10 >> 0x1b,iVar58);
                        *(uint *)&pMVar42->field_0x10 =
                             *(uint *)&pMVar42->field_0x10 & 0x7ffffff | iVar50 << 0x1b;
                        if ((local_12f8[0] & 1) != 0) {
                          __assert_fail("(uTruth[0] & 1) == 0",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMf.c"
                                        ,0x282,
                                        "int Mf_CutComputeTruthMux(Mf_Man_t *, Mf_Cut_t *, Mf_Cut_t *, Mf_Cut_t *, int, int, int, Mf_Cut_t *)"
                                       );
                        }
                        uVar41 = Vec_MemHashInsert(p->vTtMem,local_12f8);
                        if ((int)uVar41 < 0) goto LAB_0076c4b7;
                        uVar59 = *(uint *)&pMVar42->field_0x10;
                        *(uint *)&pMVar42->field_0x10 =
                             (uVar59 & 0xf8000000) + (uVar41 & 0x3ffffff) * 2 | uVar47;
                        if (((p->pPars->fGenCnf != 0) && (iVar58 < 9)) &&
                           (uVar41 == (p->vCnfSizes).nSize)) {
                          uVar59 = uVar59 >> 0x1b;
                          local_1278 = ~local_12f8[0];
                          local_1270 = ~local_12f8[1];
                          local_1268 = ~local_12f8[2];
                          local_1260 = ~local_12f8[3];
                          iVar58 = Abc_Tt8Isop(local_12f8,local_12f8,uVar59,local_1058);
                          iVar50 = Abc_Tt8Isop(&local_1278,&local_1278,uVar59,local_1058);
                          if (0x100 < iVar50 + iVar58) goto LAB_0076c590;
                          Vec_IntPush(&p->vCnfSizes,iVar50 + iVar58);
                        }
                        uVar41 = *(uint *)&pMVar42->field_0x10 >> 0x1b;
                        bVar61 = uVar41 < uVar48;
                        if (!bVar61 && uVar41 != uVar48) {
                          __assert_fail("(int)pCutR->nLeaves <= nOldSupp",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMf.c"
                                        ,0x287,
                                        "int Mf_CutComputeTruthMux(Mf_Man_t *, Mf_Cut_t *, Mf_Cut_t *, Mf_Cut_t *, int, int, int, Mf_Cut_t *)"
                                       );
                        }
                      }
                      if (bVar61) {
                        if (*(uint *)&pMVar42->field_0x10 < 0x8000000) {
                          uVar23 = 0;
                        }
                        else {
                          uVar29 = 0;
                          uVar23 = 0;
                          do {
                            uVar23 = uVar23 | 1L << ((ulong)(byte)piVar43[uVar29] & 0x3f);
                            uVar29 = uVar29 + 1;
                          } while (*(uint *)&pMVar42->field_0x10 >> 0x1b != uVar29);
                        }
                        pMVar42->Sign = uVar23;
                      }
                    }
                    uVar41 = *(uint *)&pMVar42->field_0x10;
                    uVar47 = uVar41 >> 0x1b;
                    pJVar10 = p->pPars;
                    if (pJVar10->nLutSize < (int)uVar47) goto LAB_0076c45a;
                    fVar1 = pMVar7->nFlowRefs;
                    pMVar42->Delay = 0;
                    pMVar42->Flow = 0.0;
                    if (0x7ffffff < uVar41) {
                      pMVar11 = p->pLfObjs;
                      uVar23 = 0;
                      fVar63 = 0.0;
                      uVar59 = 0;
                      do {
                        iVar58 = pMVar42->pLeaves[uVar23];
                        uVar2 = *(ushort *)&pMVar11[iVar58].field_0xc;
                        if (uVar59 <= uVar2) {
                          uVar59 = (uint)uVar2;
                        }
                        pMVar42->Delay = uVar59;
                        fVar63 = fVar63 + pMVar11[iVar58].Flow;
                        pMVar42->Flow = fVar63;
                        uVar23 = uVar23 + 1;
                      } while (uVar47 != uVar23);
                    }
                    pMVar42->Delay = (pMVar42->Delay + 1) - (uint)(uVar41 < 0x10000000);
                    if (uVar41 < 0x10000000) {
                      iVar58 = 0;
                    }
                    else if (pJVar10->fGenCnf == 0) {
                      if (pJVar10->fOptEdge == 0) {
                        iVar58 = 1;
                      }
                      else {
                        iVar58 = uVar47 + pJVar10->nAreaTuner;
                      }
                    }
                    else {
                      uVar41 = uVar41 >> 1 & 0x3ffffff;
                      if ((p->vCnfSizes).nSize <= (int)uVar41) goto LAB_0076c4d6;
                      iVar58 = (p->vCnfSizes).pArray[uVar41];
                    }
                    pMVar42->Flow = (pMVar42->Flow + (float)iVar58) / fVar1;
                    uVar41 = Mf_SetAddCut(local_11d8,iVar45,nCutNum);
                    uVar29 = (ulong)uVar41;
                  }
                }
LAB_0076c18f:
                puVar57 = puVar57 + 8;
              } while (puVar57 < local_1038 + (long)iVar28 * 8);
            }
            local_1380 = local_1380 + 8;
          } while (local_1380 < local_c38 + (long)iVar31 * 8);
        }
        puVar35 = puVar35 + 8;
      } while (puVar35 < local_838 + (long)iVar34 * 8);
    }
  }
  pMVar7->Flow = local_11d8[0]->Flow;
  *(short *)&pMVar7->field_0xc = (short)local_11d8[0]->Delay;
  iVar58 = (int)uVar29;
  iVar28 = 1;
  if (0 < iVar58) {
    uVar23 = 0;
    do {
      iVar28 = iVar28 + (*(uint *)&local_11d8[uVar23]->field_0x10 >> 0x1b) + 1;
      uVar23 = uVar23 + 1;
    } while (uVar29 != uVar23);
  }
  if (0xffff < (p->iCur & 0xffffU) + iVar28) {
    p->iCur = (p->iCur & 0xffff0000U) + 0x10000;
  }
  uVar3 = (p->vPages).nSize;
  if (uVar3 == (int)*(short *)((long)&p->iCur + 2)) {
    pvVar25 = malloc(0x40000);
    uVar46 = (p->vPages).nCap;
    if (uVar3 == uVar46) {
      if ((int)uVar46 < 0x10) {
        ppvVar26 = (p->vPages).pArray;
        if (ppvVar26 == (void **)0x0) {
          ppvVar26 = (void **)malloc(0x80);
        }
        else {
          ppvVar26 = (void **)realloc(ppvVar26,0x80);
        }
        (p->vPages).pArray = ppvVar26;
        iVar34 = 0x10;
      }
      else {
        iVar34 = uVar46 * 2;
        if (iVar34 <= (int)uVar46) goto LAB_0076c2f1;
        ppvVar26 = (p->vPages).pArray;
        if (ppvVar26 == (void **)0x0) {
          ppvVar26 = (void **)malloc((ulong)uVar46 << 4);
        }
        else {
          ppvVar26 = (void **)realloc(ppvVar26,(ulong)uVar46 << 4);
        }
        (p->vPages).pArray = ppvVar26;
      }
      (p->vPages).nCap = iVar34;
    }
LAB_0076c2f1:
    iVar34 = (p->vPages).nSize;
    (p->vPages).nSize = iVar34 + 1;
    (p->vPages).pArray[iVar34] = pvVar25;
  }
  uVar3 = p->iCur;
  p->iCur = iVar28 + uVar3;
  uVar46 = (int)uVar3 >> 0x10;
  if ((-1 < (int)uVar46) && ((int)uVar46 < (p->vPages).nSize)) {
    pvVar25 = (p->vPages).pArray[uVar46];
    *(int *)((long)pvVar25 + (ulong)(uVar3 & 0xffff) * 4) = iVar58;
    if (0 < iVar58) {
      puVar38 = (uint *)((long)pvVar25 + (ulong)(uVar3 & 0xffff) * 4);
      uVar23 = 0;
      do {
        pMVar42 = local_11d8[uVar23];
        puVar38[1] = *(uint *)&pMVar42->field_0x10 << 5 | *(uint *)&pMVar42->field_0x10 >> 0x1b;
        memcpy(puVar38 + 2,pMVar42->pLeaves,
               (ulong)(*(uint *)&pMVar42->field_0x10 >> 0x19 & 0xfffffffc));
        puVar38 = puVar38 + 1 + (*(uint *)&pMVar42->field_0x10 >> 0x1b);
        uVar23 = uVar23 + 1;
      } while (uVar29 != uVar23);
    }
    pMVar7->iCutSet = uVar3;
    if ((0 < iVar58) && (iVar58 < (int)nCutNum)) {
      p->nCutCounts[*(uint *)&local_11d8[0]->field_0x10 >> 0x1b] =
           p->nCutCounts[*(uint *)&local_11d8[0]->field_0x10 >> 0x1b] + 1;
      p->CutCount[3] = (double)iVar58 + p->CutCount[3];
      return;
    }
    __assert_fail("nCutsR > 0 && nCutsR < nCutNum",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMf.c"
                  ,0x45c,"void Mf_ObjMergeOrder(Mf_Man_t *, int)");
  }
LAB_0076c64a:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

void Mf_ObjMergeOrder( Mf_Man_t * p, int iObj )
{
    Mf_Cut_t pCuts0[MF_CUT_MAX], pCuts1[MF_CUT_MAX], pCuts[MF_CUT_MAX], * pCutsR[MF_CUT_MAX];
    Gia_Obj_t * pObj = Gia_ManObj(p->pGia, iObj);
    Mf_Obj_t * pBest = Mf_ManObj(p, iObj);
    int nLutSize = p->pPars->nLutSize;
    int nCutNum  = p->pPars->nCutNum;
    int nCuts0   = Mf_ManPrepareCuts(pCuts0, p, Gia_ObjFaninId0(pObj, iObj), 1);
    int nCuts1   = Mf_ManPrepareCuts(pCuts1, p, Gia_ObjFaninId1(pObj, iObj), 1);
    int fComp0   = Gia_ObjFaninC0(pObj);
    int fComp1   = Gia_ObjFaninC1(pObj);
    int iSibl    = Gia_ObjSibl(p->pGia, iObj);
    Mf_Cut_t * pCut0, * pCut1, * pCut0Lim = pCuts0 + nCuts0, * pCut1Lim = pCuts1 + nCuts1;
    int i, nCutsR = 0;
    for ( i = 0; i < nCutNum; i++ )
        pCutsR[i] = pCuts + i;
    if ( iSibl )
    {
        Mf_Cut_t pCuts2[MF_CUT_MAX];
        Gia_Obj_t * pObjE = Gia_ObjSiblObj(p->pGia, iObj);
        int fCompE = Gia_ObjPhase(pObj) ^ Gia_ObjPhase(pObjE);
        int nCuts2 = Mf_ManPrepareCuts(pCuts2, p, iSibl, 0);
        Mf_Cut_t * pCut2, * pCut2Lim = pCuts2 + nCuts2;
        for ( pCut2 = pCuts2; pCut2 < pCut2Lim; pCut2++ )
        {
            *pCutsR[nCutsR] = *pCut2;
            if ( pCutsR[nCutsR]->iFunc >= 0 )
                pCutsR[nCutsR]->iFunc = Abc_LitNotCond( pCutsR[nCutsR]->iFunc, fCompE );
            Mf_CutParams( p, pCutsR[nCutsR], pBest->nFlowRefs );
            nCutsR = Mf_SetAddCut( pCutsR, nCutsR, nCutNum );
        }
    }
    if ( Gia_ObjIsMuxId(p->pGia, iObj) )
    {
        Mf_Cut_t pCuts2[MF_CUT_MAX];
        int nCuts2  = Mf_ManPrepareCuts(pCuts2, p, Gia_ObjFaninId2(p->pGia, iObj), 1);
        int fComp2  = Gia_ObjFaninC2(p->pGia, pObj);
        Mf_Cut_t * pCut2, * pCut2Lim = pCuts2 + nCuts2;
        p->CutCount[0] += nCuts0 * nCuts1 * nCuts2;
        for ( pCut0 = pCuts0; pCut0 < pCut0Lim; pCut0++ )
        for ( pCut1 = pCuts1; pCut1 < pCut1Lim; pCut1++ )
        for ( pCut2 = pCuts2; pCut2 < pCut2Lim; pCut2++ )
        {
            if ( Mf_CutCountBits(pCut0->Sign | pCut1->Sign | pCut2->Sign) > nLutSize )
                continue;
            p->CutCount[1]++; 
            if ( !Mf_CutMergeOrderMux(pCut0, pCut1, pCut2, pCutsR[nCutsR], nLutSize) )
                continue;
            if ( Mf_SetLastCutIsContained(pCutsR, nCutsR) )
                continue;
            p->CutCount[2]++;
            if ( p->pPars->fCutMin && Mf_CutComputeTruthMux(p, pCut0, pCut1, pCut2, fComp0, fComp1, fComp2, pCutsR[nCutsR]) )
                pCutsR[nCutsR]->Sign = Mf_CutGetSign(pCutsR[nCutsR]->pLeaves, pCutsR[nCutsR]->nLeaves);
            Mf_CutParams( p, pCutsR[nCutsR], pBest->nFlowRefs );
            nCutsR = Mf_SetAddCut( pCutsR, nCutsR, nCutNum );
        }
    }
    else
    {
        int fIsXor = Gia_ObjIsXor(pObj);
        p->CutCount[0] += nCuts0 * nCuts1;
        for ( pCut0 = pCuts0; pCut0 < pCut0Lim; pCut0++ )
        for ( pCut1 = pCuts1; pCut1 < pCut1Lim; pCut1++ )
        {
            if ( (int)(pCut0->nLeaves + pCut1->nLeaves) > nLutSize && Mf_CutCountBits(pCut0->Sign | pCut1->Sign) > nLutSize )
                continue;
            p->CutCount[1]++; 
            if ( !Mf_CutMergeOrder(pCut0, pCut1, pCutsR[nCutsR], nLutSize) )
                continue;
            if ( Mf_SetLastCutIsContained(pCutsR, nCutsR) )
                continue;
            p->CutCount[2]++;
            if ( p->pPars->fCutMin && Mf_CutComputeTruth(p, pCut0, pCut1, fComp0, fComp1, pCutsR[nCutsR], fIsXor) )
                pCutsR[nCutsR]->Sign = Mf_CutGetSign(pCutsR[nCutsR]->pLeaves, pCutsR[nCutsR]->nLeaves);
            Mf_CutParams( p, pCutsR[nCutsR], pBest->nFlowRefs );
            nCutsR = Mf_SetAddCut( pCutsR, nCutsR, nCutNum );
        }
    }
    // debug printout
    if ( 0 )
//    if ( iObj % 1000 == 0 )
//    if ( iObj == 474 )
    {
        printf( "*** Obj = %d  FlowRefs = %.2f  MapRefs = %2d\n", iObj, pBest->nFlowRefs, pBest->nMapRefs );
        for ( i = 0; i < nCutsR; i++ )
            Mf_CutPrint( p, pCutsR[i] );
        printf( "\n" );
    } 
    // store the cutset
    pBest->Flow = pCutsR[0]->Flow;
    pBest->Delay = pCutsR[0]->Delay;
    pBest->iCutSet = Mf_ManSaveCuts( p, pCutsR, nCutsR );
    // verify
    assert( nCutsR > 0 && nCutsR < nCutNum );
//    assert( Mf_SetCheckArray(pCutsR, nCutsR) );
    p->nCutCounts[pCutsR[0]->nLeaves]++;
    p->CutCount[3] += nCutsR;
}